

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O2

_Bool xor16_populate(uint64_t *keys,uint32_t size,xor16_t *filter)

{
  ulong *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  uint16_t *puVar4;
  uint64_t uVar5;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  ulong *puVar12;
  ulong uVar13;
  int iVar14;
  size_t i;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  _Bool _Var18;
  uint16_t uVar19;
  size_t i_3;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  size_t __size;
  uint64_t rng_counter;
  xor_hashes_t hs;
  ulong local_98;
  uint64_t local_50;
  xor_hashes_t local_48;
  
  if (size == 0) {
    _Var18 = false;
  }
  else {
    local_98 = (ulong)size;
    local_50 = 1;
    uVar5 = xor_rng_splitmix64(&local_50);
    filter->seed = uVar5;
    uVar3 = filter->blockLength;
    __size = uVar3 * 0x30;
    __s = malloc(__size);
    __ptr = malloc(__size);
    __ptr_00 = malloc(local_98 << 4);
    uVar21 = 0;
    if (__ptr_00 != (void *)0x0 && (__ptr != (void *)0x0 && __s != (void *)0x0)) {
      lVar6 = uVar3 * 0x10;
      lVar8 = uVar3 * 0x20;
      do {
        if (uVar21 + 1 == 10) {
          local_98 = xor_sort_and_remove_dup(keys,local_98 & 0xffffffff);
        }
        else if (99 < uVar21) {
          uVar21 = 0;
          break;
        }
        memset(__s,0,__size);
        uVar7 = local_98 & 0xffffffff;
        for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
          xor16_get_h0_h1_h2(&local_48,keys[uVar15],filter);
          puVar1 = (ulong *)((long)__s + (ulong)local_48.h0 * 0x10);
          *puVar1 = *puVar1 ^ local_48.h;
          piVar9 = (int *)((long)__s + (ulong)local_48.h0 * 0x10 + 8);
          *piVar9 = *piVar9 + 1;
          puVar1 = (ulong *)((long)__s + (ulong)local_48.h1 * 0x10 + lVar6);
          *puVar1 = *puVar1 ^ local_48.h;
          piVar9 = (int *)((long)__s + (ulong)local_48.h1 * 0x10 + lVar6 + 8);
          *piVar9 = *piVar9 + 1;
          puVar1 = (ulong *)((long)__s + (ulong)local_48.h2 * 0x10 + lVar8);
          *puVar1 = *puVar1 ^ local_48.h;
          piVar9 = (int *)((long)__s + (ulong)local_48.h2 * 0x10 + lVar8 + 8);
          *piVar9 = *piVar9 + 1;
        }
        uVar15 = filter->blockLength;
        lVar11 = 0;
        piVar9 = (int *)((long)__s + 8);
        for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
          if (*piVar9 == 1) {
            *(int *)((long)__ptr + lVar11 * 0x10 + 8) = (int)uVar16;
            *(undefined8 *)((long)__ptr + lVar11 * 0x10) = *(undefined8 *)(piVar9 + -2);
            lVar11 = lVar11 + 1;
          }
          piVar9 = piVar9 + 4;
        }
        lVar10 = 0;
        piVar9 = (int *)((long)__s + lVar6 + 8);
        for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
          if (*piVar9 == 1) {
            *(int *)((long)__ptr + lVar10 * 0x10 + lVar6 + 8) = (int)uVar16;
            *(undefined8 *)((long)__ptr + lVar10 * 0x10 + lVar6) = *(undefined8 *)(piVar9 + -2);
            lVar10 = lVar10 + 1;
          }
          piVar9 = piVar9 + 4;
        }
        lVar17 = 0;
        piVar9 = (int *)((long)__s + lVar8 + 8);
        for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
          if (*piVar9 == 1) {
            *(int *)((long)__ptr + lVar17 * 0x10 + lVar8 + 8) = (int)uVar16;
            *(undefined8 *)((long)__ptr + lVar17 * 0x10 + lVar8) = *(undefined8 *)(piVar9 + -2);
            lVar17 = lVar17 + 1;
          }
          piVar9 = piVar9 + 4;
        }
        uVar15 = uVar15 & 0xffffffff;
        uVar16 = 0;
LAB_0010276e:
        if (lVar11 + lVar10 + lVar17 != 0) {
          do {
            lVar20 = -lVar11;
            puVar1 = (ulong *)(lVar11 * 0x10 + (long)__ptr);
            do {
              puVar12 = puVar1;
              lVar20 = lVar20 + 1;
              if (lVar20 == 1) {
                lVar11 = 0;
                goto LAB_0010287f;
              }
              uVar23 = puVar12[-1];
              puVar1 = puVar12 + -2;
            } while (*(int *)((long)__s + (ulong)(uint)uVar23 * 0x10 + 8) == 0);
            uVar22 = puVar12[-2];
            uVar2 = *(undefined4 *)((long)puVar12 + -4);
            uVar13 = ((uint)(uVar22 << 0x15) | (uint)(uVar22 >> 0x2b)) * uVar15;
            lVar11 = uVar16 * 0x10;
            *(ulong *)((long)__ptr_00 + lVar11) = uVar22;
            *(uint *)((long)__ptr_00 + lVar11 + 8) = (uint)uVar23;
            *(undefined4 *)((long)__ptr_00 + lVar11 + 0xc) = uVar2;
            lVar11 = (uVar13 >> 0x20) * 0x10;
            uVar23 = *(ulong *)((long)__s + lVar11 + lVar6) ^ uVar22;
            *(ulong *)((long)__s + lVar11 + lVar6) = uVar23;
            iVar14 = *(int *)((long)__s + lVar11 + lVar6 + 8) + -1;
            *(int *)((long)__s + lVar11 + lVar6 + 8) = iVar14;
            if (iVar14 == 1) {
              *(int *)((long)__ptr + lVar10 * 0x10 + lVar6 + 8) = (int)(uVar13 >> 0x20);
              *(ulong *)((long)__ptr + lVar10 * 0x10 + lVar6) = uVar23;
              lVar10 = lVar10 + 1;
            }
            uVar23 = (uVar22 >> 0x16 & 0xffffffff) * uVar15;
            uVar16 = uVar16 + 1;
            lVar11 = -lVar20;
            lVar24 = (uVar23 >> 0x20) * 0x10;
            uVar22 = uVar22 ^ *(ulong *)((long)__s + lVar24 + lVar8);
            *(ulong *)((long)__s + lVar24 + lVar8) = uVar22;
            iVar14 = *(int *)((long)__s + lVar24 + lVar8 + 8) + -1;
            *(int *)((long)__s + lVar24 + lVar8 + 8) = iVar14;
            if (iVar14 == 1) {
              *(int *)((long)__ptr + lVar17 * 0x10 + lVar8 + 8) = (int)(uVar23 >> 0x20);
              *(ulong *)((long)__ptr + lVar17 * 0x10 + lVar8) = uVar22;
              lVar17 = lVar17 + 1;
              lVar11 = -lVar20;
            }
          } while( true );
        }
        if (uVar16 == uVar7) {
          puVar4 = filter->fingerprints;
          for (lVar6 = uVar7 << 4; lVar6 != 0; lVar6 = lVar6 + -0x10) {
            uVar7 = *(ulong *)((long)__ptr_00 + lVar6 + -0x10);
            uVar16 = (ulong)*(uint *)((long)__ptr_00 + lVar6 + -8);
            uVar21 = (uint)(uVar7 >> 0x20);
            if (uVar16 < uVar3) {
              uVar19 = puVar4[uVar3 + (((uint)(uVar7 << 0x15) | uVar21 >> 0xb) * uVar15 >> 0x20)];
LAB_00102b1c:
              uVar21 = (uint)(uVar7 >> 0x16);
              uVar23 = uVar3 * 2;
            }
            else {
              uVar19 = puVar4[(uVar7 & 0xffffffff) * uVar15 >> 0x20];
              if (uVar16 < uVar3 * 2) goto LAB_00102b1c;
              uVar21 = (uint)(uVar7 << 0x15) | uVar21 >> 0xb;
              uVar23 = uVar3;
            }
            puVar4[uVar16] =
                 (ushort)(uVar7 >> 0x20) ^ (ushort)uVar7 ^
                 uVar19 ^ puVar4[uVar23 + (uVar21 * uVar15 >> 0x20)];
          }
          uVar21 = 1;
          break;
        }
        uVar5 = xor_rng_splitmix64(&local_50);
        filter->seed = uVar5;
        uVar21 = uVar21 + 1;
      } while( true );
    }
    _Var18 = SUB41(uVar21,0);
    free(__s);
    free(__ptr);
    free(__ptr_00);
  }
  return _Var18;
LAB_0010287f:
  lVar20 = -lVar10;
  puVar1 = (ulong *)((long)__ptr + lVar10 * 0x10 + lVar6);
  do {
    puVar12 = puVar1;
    lVar20 = lVar20 + 1;
    if (lVar20 == 1) {
      lVar10 = 0;
      goto LAB_00102982;
    }
    uVar23 = puVar12[-1];
    puVar1 = puVar12 + -2;
  } while (*(int *)((long)__s + (ulong)(uint)uVar23 * 0x10 + lVar6 + 8) == 0);
  uVar22 = puVar12[-2];
  uVar2 = *(undefined4 *)((long)puVar12 + -4);
  uVar13 = (uVar22 & 0xffffffff) * uVar15;
  lVar10 = uVar16 * 0x10;
  *(ulong *)((long)__ptr_00 + lVar10) = uVar22;
  *(uint *)((long)__ptr_00 + lVar10 + 8) = (uint)uVar23 + (int)uVar3;
  *(undefined4 *)((long)__ptr_00 + lVar10 + 0xc) = uVar2;
  lVar10 = (uVar13 >> 0x20) * 0x10;
  uVar23 = *(ulong *)((long)__s + lVar10) ^ uVar22;
  *(ulong *)((long)__s + lVar10) = uVar23;
  iVar14 = *(int *)((long)__s + lVar10 + 8) + -1;
  *(int *)((long)__s + lVar10 + 8) = iVar14;
  if (iVar14 == 1) {
    *(int *)((long)__ptr + lVar11 * 0x10 + 8) = (int)(uVar13 >> 0x20);
    *(ulong *)((long)__ptr + lVar11 * 0x10) = uVar23;
    lVar11 = lVar11 + 1;
  }
  uVar23 = (uVar22 >> 0x16 & 0xffffffff) * uVar15;
  uVar16 = uVar16 + 1;
  lVar10 = -lVar20;
  lVar20 = (uVar23 >> 0x20) * 0x10;
  uVar22 = uVar22 ^ *(ulong *)((long)__s + lVar20 + lVar8);
  *(ulong *)((long)__s + lVar20 + lVar8) = uVar22;
  iVar14 = *(int *)((long)__s + lVar20 + lVar8 + 8) + -1;
  *(int *)((long)__s + lVar20 + lVar8 + 8) = iVar14;
  if (iVar14 == 1) {
    *(int *)((long)__ptr + lVar17 * 0x10 + lVar8 + 8) = (int)(uVar23 >> 0x20);
    *(ulong *)((long)__ptr + lVar17 * 0x10 + lVar8) = uVar22;
    lVar17 = lVar17 + 1;
  }
  goto LAB_0010287f;
LAB_00102982:
  lVar20 = -lVar17;
  puVar1 = (ulong *)((long)__ptr + lVar17 * 0x10 + lVar8);
  do {
    puVar12 = puVar1;
    lVar20 = lVar20 + 1;
    if (lVar20 == 1) {
      lVar17 = 0;
      goto LAB_0010276e;
    }
    uVar23 = puVar12[-1];
    puVar1 = puVar12 + -2;
  } while (*(int *)((long)__s + (ulong)(uint)uVar23 * 0x10 + lVar8 + 8) == 0);
  uVar22 = puVar12[-2];
  uVar2 = *(undefined4 *)((long)puVar12 + -4);
  uVar13 = (uVar22 & 0xffffffff) * uVar15;
  lVar17 = uVar16 * 0x10;
  *(ulong *)((long)__ptr_00 + lVar17) = uVar22;
  *(uint *)((long)__ptr_00 + lVar17 + 8) = (uint)uVar23 + (int)uVar3 * 2;
  *(undefined4 *)((long)__ptr_00 + lVar17 + 0xc) = uVar2;
  lVar17 = (uVar13 >> 0x20) * 0x10;
  uVar23 = *(ulong *)((long)__s + lVar17) ^ uVar22;
  *(ulong *)((long)__s + lVar17) = uVar23;
  iVar14 = *(int *)((long)__s + lVar17 + 8) + -1;
  *(int *)((long)__s + lVar17 + 8) = iVar14;
  if (iVar14 == 1) {
    *(int *)((long)__ptr + lVar11 * 0x10 + 8) = (int)(uVar13 >> 0x20);
    *(ulong *)((long)__ptr + lVar11 * 0x10) = uVar23;
    lVar11 = lVar11 + 1;
  }
  uVar23 = ((uint)(uVar22 << 0x15) | (uint)(uVar22 >> 0x2b)) * uVar15;
  uVar16 = uVar16 + 1;
  lVar17 = -lVar20;
  lVar20 = (uVar23 >> 0x20) * 0x10;
  uVar22 = uVar22 ^ *(ulong *)((long)__s + lVar20 + lVar6);
  *(ulong *)((long)__s + lVar20 + lVar6) = uVar22;
  iVar14 = *(int *)((long)__s + lVar20 + lVar6 + 8) + -1;
  *(int *)((long)__s + lVar20 + lVar6 + 8) = iVar14;
  if (iVar14 == 1) {
    *(int *)((long)__ptr + lVar10 * 0x10 + lVar6 + 8) = (int)(uVar23 >> 0x20);
    *(ulong *)((long)__ptr + lVar10 * 0x10 + lVar6) = uVar22;
    lVar10 = lVar10 + 1;
  }
  goto LAB_00102982;
}

Assistant:

static inline bool xor16_populate(uint64_t *keys, uint32_t size, xor16_t *filter) {
  if(size == 0) { return false; }
  uint64_t rng_counter = 1;
  filter->seed = xor_rng_splitmix64(&rng_counter);
  size_t arrayLength = (size_t)(filter->blockLength) * 3; // size of the backing array
  size_t blockLength = (size_t)(filter->blockLength);

  xor_xorset_t *sets =
      (xor_xorset_t *)malloc(arrayLength * sizeof(xor_xorset_t));

  xor_keyindex_t *Q =
      (xor_keyindex_t *)malloc(arrayLength * sizeof(xor_keyindex_t));

  xor_keyindex_t *stack =
      (xor_keyindex_t *)malloc(size * sizeof(xor_keyindex_t));

  if ((sets == NULL) || (Q == NULL) || (stack == NULL)) {
    free(sets);
    free(Q);
    free(stack);
    return false;
  }
  xor_xorset_t *sets0 = sets;
  xor_xorset_t *sets1 = sets + blockLength;
  xor_xorset_t *sets2 = sets + 2 * blockLength;

  xor_keyindex_t *Q0 = Q;
  xor_keyindex_t *Q1 = Q + blockLength;
  xor_keyindex_t *Q2 = Q + 2 * blockLength;

  int iterations = 0;

  while (true) {
    iterations ++;
    if(iterations == XOR_SORT_ITERATIONS) {
      size = (uint32_t)xor_sort_and_remove_dup(keys, size);
    }
    if(iterations > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(sets);
      free(Q);
      free(stack);
      return false;
    }

    memset(sets, 0, sizeof(xor_xorset_t) * arrayLength);
    for (size_t i = 0; i < size; i++) {
      uint64_t key = keys[i];
      xor_hashes_t hs = xor16_get_h0_h1_h2(key, filter);
      sets0[hs.h0].xormask ^= hs.h;
      sets0[hs.h0].count++;
      sets1[hs.h1].xormask ^= hs.h;
      sets1[hs.h1].count++;
      sets2[hs.h2].xormask ^= hs.h;
      sets2[hs.h2].count++;
    }
    // todo: the flush should be sync with the detection that follows
    // scan for values with a count of one
    size_t Q0size = 0, Q1size = 0, Q2size = 0;
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets0[i].count == 1) {
        Q0[Q0size].index = (uint32_t)i;
        Q0[Q0size].hash = sets0[i].xormask;
        Q0size++;
      }
    }

    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets1[i].count == 1) {
        Q1[Q1size].index = (uint32_t)i;
        Q1[Q1size].hash = sets1[i].xormask;
        Q1size++;
      }
    }
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets2[i].count == 1) {
        Q2[Q2size].index = (uint32_t)i;
        Q2[Q2size].hash = sets2[i].xormask;
        Q2size++;
      }
    }

    size_t stack_size = 0;
    while (Q0size + Q1size + Q2size > 0) {
      while (Q0size > 0) {
        xor_keyindex_t keyindex = Q0[--Q0size];
        size_t index = keyindex.index;
        if (sets0[index].count == 0)
          continue; // not actually possible after the initial scan.
        //sets0[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h1 = xor16_get_h1(hash, filter);
        uint32_t h2 = xor16_get_h2(hash, filter);

        stack[stack_size] = keyindex;
        stack_size++;
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q1size > 0) {
        xor_keyindex_t keyindex = Q1[--Q1size];
        size_t index = keyindex.index;
        if (sets1[index].count == 0)
          continue;
        //sets1[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h0 = xor16_get_h0(hash, filter);
        uint32_t h2 = xor16_get_h2(hash, filter);
        keyindex.index += (uint32_t)blockLength;
        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q2size > 0) {
        xor_keyindex_t keyindex = Q2[--Q2size];
        size_t index = keyindex.index;
        if (sets2[index].count == 0)
          continue;

        //sets2[index].count = 0;
        uint64_t hash = keyindex.hash;

        uint32_t h0 = xor16_get_h0(hash, filter);
        uint32_t h1 = xor16_get_h1(hash, filter);
        keyindex.index += 2 * (uint32_t)blockLength;

        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }

      }
    }
    if (stack_size == size) {
      // success
      break;
    }

    filter->seed = xor_rng_splitmix64(&rng_counter);
  }
  uint16_t * fingerprints0 = filter->fingerprints;
  uint16_t * fingerprints1 = filter->fingerprints + blockLength;
  uint16_t * fingerprints2 = filter->fingerprints + 2 * blockLength;

  size_t stack_size = size;
  while (stack_size > 0) {
    xor_keyindex_t ki = stack[--stack_size];
    uint64_t val = xor_fingerprint(ki.hash);
    if(ki.index < blockLength) {
      val ^= (uint32_t)fingerprints1[xor16_get_h1(ki.hash,filter)] ^ fingerprints2[xor16_get_h2(ki.hash,filter)];
    } else if(ki.index < 2 * blockLength) {
      val ^= (uint32_t)fingerprints0[xor16_get_h0(ki.hash,filter)] ^ fingerprints2[xor16_get_h2(ki.hash,filter)];
    } else {
      val ^= (uint32_t)fingerprints0[xor16_get_h0(ki.hash,filter)] ^ fingerprints1[xor16_get_h1(ki.hash,filter)];
    }
    filter->fingerprints[ki.index] = (uint16_t)val;
  }

  free(sets);
  free(Q);
  free(stack);
  return true;
}